

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialization_pipeline<TreesIndexer,std::istream>
               (TreesIndexer *model,basic_istream<char,_std::char_traits<char>_> *in)

{
  byte bVar1;
  runtime_error *prVar2;
  PlatformSize PVar3;
  bool lacks_range_penalty;
  bool lacks_scoring_metric;
  bool has_same_endianness;
  uint8_t model_in;
  bool has_same_size_t_size;
  bool has_same_int_size;
  allocator<char> local_185;
  allocator<char> local_184;
  allocator<char> local_183;
  allocator<char> local_182;
  bool lacks_indexer;
  size_t size_model;
  vector<char,_std::allocator<char>_> buffer;
  PlatformSize saved_size_t;
  PlatformSize saved_int_t;
  SignalSwitcher ss;
  PlatformEndianness saved_endian;
  uint8_t ending_type;
  size_t jump_ahead;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  SignalSwitcher::SignalSwitcher(&ss);
  check_setup_info<std::istream>
            (in,&has_same_int_size,&has_same_size_t_size,&has_same_endianness,&saved_int_t,
             &saved_size_t,&saved_endian,&lacks_range_penalty,&lacks_scoring_metric,&lacks_indexer);
  read_bytes<unsigned_char>(&model_in,1,in);
  if (model_in != '\x05') {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"Object to de-serialize does not match with the supplied type.\n");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((((has_same_int_size == false) || (has_same_size_t_size != true)) ||
      ((has_same_endianness & 1U) == 0)) ||
     ((lacks_range_penalty != false || (lacks_scoring_metric != false)))) {
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = has_same_endianness ^ 1;
    PVar3 = saved_size_t ^ Is32Bit;
    if ((saved_int_t ^ Is16Bit) == 0 && PVar3 == 0) {
      read_bytes<unsigned_long,unsigned_int>(&size_model,1,in,&buffer,(bool)(bVar1 & 1));
      deserialize_model<std::istream,short,unsigned_int>
                (model,in,&buffer,(bool)(bVar1 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else if ((saved_int_t ^ Is32Bit) == 0 && PVar3 == 0) {
      read_bytes<unsigned_long,unsigned_int>(&size_model,1,in,&buffer,(bool)(bVar1 & 1));
      deserialize_model<std::istream,int,unsigned_int>
                (model,in,&buffer,(bool)(bVar1 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else if (saved_int_t == Is64Bit && PVar3 == 0) {
      read_bytes<unsigned_long,unsigned_int>(&size_model,1,in,&buffer,(bool)(bVar1 & 1));
      deserialize_model<std::istream,long,unsigned_int>
                (model,in,&buffer,(bool)(bVar1 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else if ((saved_int_t ^ Is16Bit) == 0 && (saved_size_t ^ Is64Bit) == 0) {
      read_bytes<unsigned_long,unsigned_long>(&size_model,1,in,&buffer,(bool)(bVar1 & 1));
      deserialize_model<std::istream,short,unsigned_long>
                (model,in,&buffer,(bool)(bVar1 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else if ((saved_int_t ^ Is32Bit) == 0 && (saved_size_t ^ Is64Bit) == 0) {
      read_bytes<unsigned_long,unsigned_long>(&size_model,1,in,&buffer,(bool)(bVar1 & 1));
      deserialize_model<std::istream,int,unsigned_long>
                (model,in,&buffer,(bool)(bVar1 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    else {
      if ((saved_int_t != Is64Bit) || (saved_size_t != Is64Bit)) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Unexpected error in ",&local_182);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/serialize.cpp"
                   ,&local_183);
        std::operator+(&local_60,&local_80,&local_a0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,":",&local_184);
        std::operator+(&local_40,&local_60,&local_c0);
        std::__cxx11::to_string(&local_e0,0x872);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ending_type,&local_40,&local_e0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,
                   ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                   ,&local_185);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &jump_ahead,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ending_type,&local_100);
        std::runtime_error::runtime_error(prVar2,(string *)&jump_ahead);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      read_bytes<unsigned_long,unsigned_long>(&size_model,1,in,&buffer,(bool)(bVar1 & 1));
      deserialize_model<std::istream,long,unsigned_long>
                (model,in,&buffer,(bool)(bVar1 & 1),lacks_range_penalty,lacks_scoring_metric);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  }
  else {
    read_bytes<unsigned_long>(&size_model,1,in);
    deserialize_model<std::istream>(model,in);
  }
  check_interrupt_switch(&ss);
  if (lacks_range_penalty == true) {
    check_interrupt_switch(&ss);
  }
  read_bytes<unsigned_char>(&ending_type,1,in);
  read_bytes<unsigned_long>(&jump_ahead,1,in);
  SignalSwitcher::~SignalSwitcher(&ss);
  return;
}

Assistant:

void deserialization_pipeline(Model &model, itype &in)
{
    SignalSwitcher ss = SignalSwitcher();

    bool has_same_int_size;
    bool has_same_size_t_size;
    bool has_same_endianness;
    PlatformSize saved_int_t;
    PlatformSize saved_size_t;
    PlatformEndianness saved_endian;
    bool lacks_range_penalty;
    bool lacks_scoring_metric;
    bool lacks_indexer; /* <- ignored */

    check_setup_info(
        in,
        has_same_int_size,
        has_same_size_t_size,
        has_same_endianness,
        saved_int_t,
        saved_size_t,
        saved_endian,
        lacks_range_penalty,
        lacks_scoring_metric,
        lacks_indexer
    );

    uint8_t model_type = get_model_code(model);
    uint8_t model_in;
    read_bytes<uint8_t>((void*)&model_in, (size_t)1, in);
    if (model_type != model_in)
        throw std::runtime_error("Object to de-serialize does not match with the supplied type.\n");

    size_t size_model;
    if (has_same_int_size && has_same_size_t_size && has_same_endianness && !lacks_range_penalty && !lacks_scoring_metric)
    {
        read_bytes<size_t>((void*)&size_model, (size_t)1, in);
        deserialize_model(model, in);
    }
    
    else
    {
        std::vector<char> buffer;
        const bool diff_endian = !has_same_endianness;

        if (saved_int_t == Is16Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int16_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is32Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int32_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is64Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int64_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is16Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is32Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int32_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is64Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int64_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else
        {
            unexpected_error();
        }
    }

    check_interrupt_switch(ss);

    if (lacks_range_penalty)
    {
        add_range_penalty(model);
        check_interrupt_switch(ss);
    }

    /* Not currently used, but left in case the format changes */
    uint8_t ending_type;
    read_bytes<uint8_t>((void*)&ending_type, (size_t)1, in);
    size_t jump_ahead;
    read_bytes<size_t>((void*)&jump_ahead, (size_t)1, in);
}